

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

int epoll_fd_state(fd_state **fds_p,knote *kn,_Bool disabled)

{
  int iVar1;
  uint uVar2;
  fd_state *pfVar3;
  uint uVar4;
  
  pfVar3 = *fds_p;
  if (pfVar3 == (fd_state *)0x0) {
    pfVar3 = kn->kn_fds;
  }
  if (pfVar3 == (fd_state *)0x0) {
    pfVar3 = (kn->kn_kq->kq_fd_st).rbh_root;
    if (pfVar3 != (fd_state *)0x0) {
      iVar1 = (int)(kn->kev).ident;
      do {
        uVar2 = (uint)(pfVar3->fds_fd < iVar1);
        uVar4 = (uint)(iVar1 < pfVar3->fds_fd);
        if (-1 < (int)(uVar2 - uVar4)) {
          if (uVar2 == uVar4) goto LAB_001050c0;
          pfVar3 = (fd_state *)&(pfVar3->fds_entries).rbe_right;
        }
        pfVar3 = (pfVar3->fds_entries).rbe_left;
      } while (pfVar3 != (fd_state *)0x0);
    }
    pfVar3 = (fd_state *)0x0;
LAB_001050c0:
    if (pfVar3 == (fd_state *)0x0) {
      return 0;
    }
  }
  *fds_p = pfVar3;
  uVar2 = 0;
  uVar4 = 0;
  if (pfVar3->fds_read != (knote *)0x0) {
    uVar4 = (uint)((((pfVar3->fds_read->kev).flags & 0x8008) == 0) != disabled);
  }
  if (pfVar3->fds_write != (knote *)0x0) {
    uVar2 = (uint)((((pfVar3->fds_write->kev).flags & 0x8008) == 0) != disabled) << 2;
  }
  return uVar2 | uVar4;
}

Assistant:

int epoll_fd_state(struct fd_state **fds_p, struct knote *kn, bool disabled)
{
    int             state = 0;
    int             fd = kn->kev.ident;
    struct fd_state *fds = *fds_p;

    if (!fds) {
        fds = kn->kn_fds;
        if(fds) dbg_printf("fd_state: from-kn fd=%i", fd);
    }
    if (!fds) {
        dbg_printf("fd_state: find fd=%i", fd);

        fds = RB_FIND(fd_st, &kn->kn_kq->kq_fd_st, &(struct fd_state){ .fds_fd = fd });
        if (!fds) return (0);
    }

    *fds_p = fds;

    state |= (fds->fds_read && (disabled == ((fds->fds_read->kev.flags & (EV_DISABLE | EV_EOF)) != 0))) * EPOLLIN;
    state |= (fds->fds_write && (disabled == ((fds->fds_write->kev.flags & (EV_DISABLE | EV_EOF)) != 0))) * EPOLLOUT;

    return state;
}